

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O3

void testing::internal::PrintCharTo(char c,int char_code,ostream *os)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"\'",1);
  PrintAsWideCharLiteralTo((uint)(byte)c,os);
  std::__ostream_insert<char,std::char_traits<char>>(os,"\'",1);
  if (c != '\0') {
    std::__ostream_insert<char,std::char_traits<char>>(os," (",2);
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)os,char_code);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,")",1);
    return;
  }
  return;
}

Assistant:

void PrintCharTo(char c, int char_code, ostream* os) {
  *os << "'";
  PrintAsCharLiteralTo(c, os);
  *os << "'";
  if (c != '\0')
    *os << " (" << char_code << ")";
}